

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LocalSingleStoreElimPass::FeedsAStore
          (LocalSingleStoreElimPass *this,Instruction *inst)

{
  bool bVar1;
  DefUseManager *this_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_single_store_elim_pass.cpp:257:44)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/local_single_store_elim_pass.cpp:257:44)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  bVar1 = analysis::DefUseManager::WhileEachUser
                    (this_00,inst,(function<bool_(spvtools::opt::Instruction_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return !bVar1;
}

Assistant:

bool LocalSingleStoreElimPass::FeedsAStore(Instruction* inst) const {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  return !def_use_mgr->WhileEachUser(inst, [this](Instruction* user) {
    switch (user->opcode()) {
      case spv::Op::OpStore:
        return false;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
      case spv::Op::OpCopyObject:
        return !FeedsAStore(user);
      case spv::Op::OpLoad:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpName:
        return true;
      default:
        // Don't know if this instruction modifies the variable.
        // Conservatively assume it is a store.
        return user->IsDecoration();
    }
  });
}